

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::Value::setSize(Value *this,size_t size)

{
  bool bVar1;
  Value *v;
  Ref *pRVar2;
  Ref local_30;
  ulong local_28;
  size_t i;
  size_t old;
  size_t size_local;
  Value *this_local;
  
  old = size;
  size_local = (size_t)this;
  bVar1 = isArray(this);
  if (bVar1) {
    i = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::size
                  (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>)
    ;
    if (i != old) {
      ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::resize
                (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,
                 old);
    }
    if (i < old) {
      for (local_28 = i; local_28 < old; local_28 = local_28 + 1) {
        v = GlobalMixedArena::alloc<cashew::Value>((GlobalMixedArena *)&arena);
        Ref::Ref(&local_30,v);
        pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                           (&((this->field_1).arr)->
                             super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,local_28);
        pRVar2->inst = local_30.inst;
      }
    }
    return;
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x1a0,"void cashew::Value::setSize(size_t)");
}

Assistant:

void setSize(size_t size) {
    assert(isArray());
    auto old = arr->size();
    if (old != size) {
      arr->resize(size);
    }
    if (old < size) {
      for (auto i = old; i < size; i++) {
        (*arr)[i] = arena.alloc<Value>();
      }
    }
  }